

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table_visitor.cpp
# Opt level: O0

void __thiscall
symbol_table_visitor::assert_type(symbol_table_visitor *this,Type *checking,Type *needed)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  Type *local_20;
  Type *needed_local;
  Type *checking_local;
  symbol_table_visitor *this_local;
  
  local_20 = needed;
  needed_local = checking;
  checking_local = (Type *)this;
  bVar1 = std::operator!=(checking->name,needed->name);
  if ((!bVar1) && ((needed_local->is_array & 1U) == (local_20->is_array & 1U))) {
    return;
  }
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       __cxa_allocate_exception(0x20);
  std::operator+(&local_c0,"syntax error: got ",needed_local->name);
  pcVar2 = "";
  if ((needed_local->is_array & 1U) != 0) {
    pcVar2 = "[]";
  }
  std::operator+(&local_a0,&local_c0,pcVar2);
  std::operator+(&local_80,&local_a0,", ");
  std::operator+(&local_60,&local_80,local_20->name);
  pcVar2 = "";
  if ((local_20->is_array & 1U) != 0) {
    pcVar2 = "[]";
  }
  std::operator+(&local_40,&local_60,pcVar2);
  std::operator+(__return_storage_ptr__,&local_40," expected");
  __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void symbol_table_visitor::assert_type(const Type* checking, const Type* needed) {
    if (*checking->name != *needed->name || checking->is_array != needed->is_array) {
        throw "syntax error: got " + *checking->name + (checking->is_array ? "[]" : "") + 
            ", " + *needed->name + (needed->is_array ? "[]" : "") + " expected";
    }
}